

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O2

void __thiscall
IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true>::~ProcessGroup
          (ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true> *this)

{
  __pointer_type this_00;
  
  this_00 = (this->_first_failure)._M_b._M_p;
  if (this_00 != (__pointer_type)0x0) {
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this_00,0x20);
  std::
  vector<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
  ::~vector(&this->_fixed_pool);
  IlmThread_3_4::Semaphore::~Semaphore(&this->_sem);
  return;
}

Assistant:

~ProcessGroup()
    {
        std::string *cur = _first_failure.load ();
        delete cur;
    }